

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O1

ON__UINT32
ON_UnicodeMapCodePoint(ON_Locale *locale,ON_StringMapType map_type,ON__UINT32 unicode_code_point)

{
  bool bVar1;
  ON__UINT32 OVar2;
  int iVar3;
  int iVar4;
  ON_StringMapType map_type_00;
  ON__UINT32 mapped_unicode_code_point;
  wchar_t mapped_w [7];
  wchar_t w [7];
  ON_UnicodeErrorParameters e;
  ON__UINT32 local_6c;
  wchar_t local_68 [8];
  wchar_t local_48 [7];
  ON_UnicodeErrorParameters local_2c;
  
  bVar1 = ON_Locale::IsOrdinalOrInvariantCulture(locale);
  if (bVar1) {
    map_type_00 = Identity;
    if (map_type < (LowerCase|UpperCase)) {
      map_type_00 = map_type;
    }
    OVar2 = MapCodePointOrdinal(unicode_code_point,0x10ffff,map_type_00);
    return OVar2;
  }
  local_48[4] = 0;
  local_48[5] = L'\0';
  local_48[6] = L'\0';
  local_48[0] = L'\0';
  local_48[1] = L'\0';
  local_48[2] = 0;
  local_48[3] = 0;
  local_68[4] = 0;
  local_68[5] = L'\0';
  local_68[6] = L'\0';
  local_68[0] = L'\0';
  local_68[1] = L'\0';
  local_68[2] = 0;
  local_68[3] = 0;
  iVar3 = ON_EncodeWideChar(unicode_code_point,6,local_48);
  if (0 < iVar3) {
    iVar4 = ON_wString::MapString(locale,map_type,local_48,iVar3,local_68,6);
    if (iVar4 == 0) {
      bVar1 = true;
      local_6c = 0;
    }
    else {
      local_6c = unicode_code_point;
      iVar3 = ON_DecodeWideChar(local_48,iVar3,&local_2c,&local_6c);
      bVar1 = iVar4 != iVar3;
    }
    if (!bVar1) {
      return local_6c;
    }
  }
  return unicode_code_point;
}

Assistant:

ON__UINT32 ON_UnicodeMapCodePoint(
  const ON_Locale& locale,
  ON_StringMapType map_type,
  ON__UINT32 unicode_code_point
  )
{
  if (locale.IsOrdinalOrInvariantCulture())
    return ON_UnicodeMapCodePointOrdinal(ON_StringMapOrdinalTypeFromStringMapType(map_type), unicode_code_point);

  wchar_t w[7] = { 0 };
  wchar_t mapped_w[7] = { 0 };
  int w_count = ON_EncodeWideChar(unicode_code_point, 6,  w);
  if (w_count > 0)
  {
    int mapped_count = ON_wString::MapString(locale, map_type, w, w_count, mapped_w, sizeof(mapped_w) / sizeof(mapped_w[0]) - 1);
    if (mapped_count > 0)
    {
      ON__UINT32 mapped_unicode_code_point = unicode_code_point;
      ON_UnicodeErrorParameters e;
      if ( mapped_count == ON_DecodeWideChar(w,w_count,&e,&mapped_unicode_code_point) )
        return mapped_unicode_code_point;
    }
  }

  return unicode_code_point;
}